

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86emithelper.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::x86::EmitHelper::emitProlog(EmitHelper *this,FuncFrame *frame)

{
  uint8_t uVar1;
  BaseEmitter *this_00;
  uint32_t instId;
  Signature SVar2;
  Error EVar3;
  FuncAttributes FVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Gp *o1;
  RegGroup group;
  uint32_t xSize;
  uint32_t xInst;
  BitWordIterator<unsigned_int> it_1;
  Gp zsp;
  BitWordIterator<unsigned_int> it;
  Gp zbp;
  Gp saReg;
  Gp gpReg;
  uint32_t local_a4;
  uint32_t local_a0;
  RegMask local_9c;
  Gp local_98;
  Operand_ local_88;
  Gp local_78;
  Gp local_68;
  Operand_ local_58;
  Gp local_48;
  
  this_00 = (this->super_BaseEmitHelper)._emitter;
  SVar2._bits = FuncFrame::savedRegs(frame,k0);
  local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       (this_00->_gpSignature)._bits;
  local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = 4;
  local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  local_78.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = 5;
  local_78.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  local_78.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._0_8_ =
       CONCAT44(4,local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits);
  local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
  local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
  FVar4 = frame->_attributes;
  local_78.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
       local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits;
  local_48.super_Reg.super_BaseReg.super_Operand.super_Operand_._0_8_ =
       local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._0_8_;
  local_48.super_Reg.super_BaseReg.super_Operand.super_Operand_._data =
       local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._data;
  if ((char)FVar4 < '\0') {
    EVar3 = BaseEmitter::_emitI(this_00,(this_00->_environment)._arch & 1 ^ 0xb1);
    if (EVar3 != 0) {
      return EVar3;
    }
    FVar4 = frame->_attributes;
  }
  if ((FVar4 & kHasPreservedFP) != kNoAttributes) {
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::push
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_78);
    if (EVar3 != 0) {
      return EVar3;
    }
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_78,&local_98)
    ;
    if (EVar3 != 0) {
      return EVar3;
    }
    SVar2._bits = SVar2._bits & 0xffffffdf;
  }
  local_88._signature._bits = SVar2._bits;
  while (SVar2._bits != 0) {
    uVar5 = Support::BitWordIterator<unsigned_int>::next((BitWordIterator<unsigned_int> *)&local_88)
    ;
    local_48.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId = uVar5;
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::push
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_48);
    if (EVar3 != 0) {
      return EVar3;
    }
    SVar2._bits = local_88._signature._bits;
  }
  uVar1 = frame->_saRegId;
  if ((uVar1 != '\x04') && (uVar1 != 0xff)) {
    local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId._0_1_ = uVar1;
    local_68.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
    if ((frame->_attributes & kHasPreservedFP) == kNoAttributes) {
      o1 = &local_98;
    }
    else {
      if (uVar1 == '\x05') goto LAB_0013ddee;
      o1 = &local_78;
    }
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_68,o1);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
LAB_0013ddee:
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    local_88._data[0] = -(uint)frame->_finalStackAlignment;
    local_88._signature._bits = 4;
    local_88._baseId = 0;
    local_88._data[1] = (int)local_88._data[0] >> 0x1f;
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::and_
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_98,
                       (Imm *)&local_88);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  local_88._data[0] = frame->_stackAdjustment;
  if (local_88._data[0] != 0) {
    local_88._signature._bits = 4;
    local_88._baseId = 0;
    local_88._data[1] = 0;
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::sub
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,&local_98,
                       (Imm *)&local_88);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  if ((frame->_minDynamicAlignment <= frame->_finalStackAlignment) &&
     (local_88._data[1] = frame->_daOffset, local_88._data[1] != 0xffffffff)) {
    local_88._0_8_ =
         CONCAT44(local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId,
                  local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits) &
         0xffffffff000000f8 | 2;
    local_88._data[0] = 0;
    EVar3 = EmitterExplicitT<asmjit::v1_14::x86::Emitter>::mov
                      ((EmitterExplicitT<asmjit::v1_14::x86::Emitter> *)this_00,(Mem *)&local_88,
                       &local_68);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  local_88._data[1] = frame->_extraRegSaveOffset;
  local_88._0_8_ =
       CONCAT44(local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId,
                local_98.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits) &
       0xffffffff000000f8 | 2;
  local_88._data[0] = 0;
  group = kVec;
  do {
    if (group == kPC) {
      return 0;
    }
    local_9c = FuncFrame::savedRegs(frame,group);
    if (local_9c != 0) {
      local_a0 = 0;
      local_58._signature._bits = 1;
      local_58._baseId = 0xff;
      local_58._data[0] = 0;
      local_58._data[1] = 0;
      local_a4 = 0;
      EVar3 = X86Internal_setupSaveRestoreInfo(group,frame,(Reg *)&local_58,&local_a0,&local_a4);
      instId = local_a0;
      uVar5 = local_a4;
      if (EVar3 != 0) {
        return EVar3;
      }
      do {
        uVar6 = Support::BitWordIterator<unsigned_int>::next
                          ((BitWordIterator<unsigned_int> *)&local_9c);
        local_58._baseId = uVar6;
        EVar3 = BaseEmitter::_emitI(this_00,instId,&local_88,&local_58);
        if (EVar3 != 0) {
          return EVar3;
        }
        local_88._data[1] = local_88._data[1] + uVar5;
      } while (local_9c != 0);
    }
    group = group + kVec;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitProlog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();
  uint32_t gpSaved = frame.savedRegs(RegGroup::kGp);

  Gp zsp = emitter->zsp();   // ESP|RSP register.
  Gp zbp = emitter->zbp();   // EBP|RBP register.
  Gp gpReg = zsp;            // General purpose register (temporary).
  Gp saReg = zsp;            // Stack-arguments base pointer.

  // Emit: 'endbr32' or 'endbr64' (indirect branch protection).
  if (frame.hasIndirectBranchProtection()) {
    InstId instId = emitter->is32Bit() ? Inst::kIdEndbr32 : Inst::kIdEndbr64;
    ASMJIT_PROPAGATE(emitter->emit(instId));
  }

  // Emit: 'push zbp'
  //       'mov  zbp, zsp'.
  if (frame.hasPreservedFP()) {
    gpSaved &= ~Support::bitMask(Gp::kIdBp);
    ASMJIT_PROPAGATE(emitter->push(zbp));
    ASMJIT_PROPAGATE(emitter->mov(zbp, zsp));
  }

  // Emit: 'push gp' sequence.
  {
    Support::BitWordIterator<RegMask> it(gpSaved);
    while (it.hasNext()) {
      gpReg.setId(it.next());
      ASMJIT_PROPAGATE(emitter->push(gpReg));
    }
  }

  // Emit: 'mov saReg, zsp'.
  uint32_t saRegId = frame.saRegId();
  if (saRegId != BaseReg::kIdBad && saRegId != Gp::kIdSp) {
    saReg.setId(saRegId);
    if (frame.hasPreservedFP()) {
      if (saRegId != Gp::kIdBp)
        ASMJIT_PROPAGATE(emitter->mov(saReg, zbp));
    }
    else {
      ASMJIT_PROPAGATE(emitter->mov(saReg, zsp));
    }
  }

  // Emit: 'and zsp, StackAlignment'.
  if (frame.hasDynamicAlignment()) {
    ASMJIT_PROPAGATE(emitter->and_(zsp, -int32_t(frame.finalStackAlignment())));
  }

  // Emit: 'sub zsp, StackAdjustment'.
  if (frame.hasStackAdjustment()) {
    ASMJIT_PROPAGATE(emitter->sub(zsp, frame.stackAdjustment()));
  }

  // Emit: 'mov [zsp + DAOffset], saReg'.
  if (frame.hasDynamicAlignment() && frame.hasDAOffset()) {
    Mem saMem = ptr(zsp, int32_t(frame.daOffset()));
    ASMJIT_PROPAGATE(emitter->mov(saMem, saReg));
  }

  // Emit 'movxxx [zsp + X], {[x|y|z]mm, k}'.
  {
    Mem xBase = ptr(zsp, int32_t(frame.extraRegSaveOffset()));

    for (RegGroup group : Support::EnumValues<RegGroup, RegGroup(1), RegGroup::kMaxVirt>{}) {
      Support::BitWordIterator<RegMask> it(frame.savedRegs(group));
      if (it.hasNext()) {
        Reg xReg;
        uint32_t xInst = 0;
        uint32_t xSize = 0;
        ASMJIT_PROPAGATE(X86Internal_setupSaveRestoreInfo(group, frame, xReg, xInst, xSize));
        do {
          xReg.setId(it.next());
          ASMJIT_PROPAGATE(emitter->emit(xInst, xBase, xReg));
          xBase.addOffsetLo32(int32_t(xSize));
        } while (it.hasNext());
      }
    }
  }

  return kErrorOk;
}